

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O0

void __thiscall
irr::io::CZipReader::CZipReader
          (CZipReader *this,IFileSystem *fs,IReadFile *file,bool ignoreCase,bool ignorePaths,
          bool isGZip)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  undefined4 in_ECX;
  IFileArchive *in_RDX;
  size_type in_RSI;
  path *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  CZipReader *in_stack_000000c8;
  IFileArchive *this_00;
  size_type sVar4;
  undefined2 uVar5;
  path *vtt;
  CFileList *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDX;
  sVar4 = in_RSI;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[3].str._M_string_length);
  uVar5 = (undefined2)(sVar4 >> 0x30);
  IFileArchive::IFileArchive(this_00,(void **)CONCAT44(in_ECX,in_R8D));
  vtt = in_RDI + 4;
  if (in_RDX == (IFileArchive *)0x0) {
    core::string<char>::string<char>((string<char> *)this_00,(char *)CONCAT44(in_ECX,in_R8D));
  }
  else {
    (*in_RDX->_vptr_IFileArchive[4])();
    core::string<char>::string((string<char> *)this_00,(string<char> *)CONCAT44(in_ECX,in_R8D));
  }
  CFileList::CFileList
            (in_stack_ffffffffffffffc0,(void **)vtt,in_RDI,SUB21((ushort)uVar5 >> 8,0),
             SUB21(uVar5,0));
  core::string<char>::~string((string<char> *)0x387a6f);
  *(undefined ***)&in_RDI->str = &PTR__CZipReader_00442350;
  *(undefined ***)&in_RDI[2].str = &PTR_createAndOpenFile_004423d8;
  in_RDI[3].str._M_string_length = (size_type)&PTR__CZipReader_00442430;
  *(undefined ***)&in_RDI[4].str = &PTR_getFileCount_004424b8;
  (in_RDI->str)._M_string_length = in_RSI;
  *(IFileArchive **)&(in_RDI->str).field_2 = in_RDX;
  core::array<irr::io::SZipFileEntry>::array((array<irr::io::SZipFileEntry> *)this_00);
  in_RDI[1].str.field_2._M_local_buf[8] = in_R9B & 1;
  if ((in_RDI->str).field_2._M_allocated_capacity != 0) {
    plVar1 = (long *)(in_RDI->str).field_2._M_allocated_capacity;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    if ((in_RDI[1].str.field_2._M_local_buf[8] & 1U) == 0) {
      do {
        bVar3 = scanZipHeader((CZipReader *)fs,file._7_1_);
      } while (bVar3);
    }
    else {
      do {
        bVar3 = scanGZipHeader(in_stack_000000c8);
      } while (bVar3);
    }
    lVar2 = *(long *)(*(long *)&in_RDI->str + -0x28);
    (**(code **)(*(long *)(&(in_RDI->str)._M_dataplus + lVar2) + 0x50))
              (&(in_RDI->str)._M_dataplus + lVar2);
  }
  return;
}

Assistant:

CZipReader::CZipReader(IFileSystem *fs, IReadFile *file, bool ignoreCase, bool ignorePaths, bool isGZip) :
		CFileList((file ? file->getFileName() : io::path("")), ignoreCase, ignorePaths), FileSystem(fs), File(file), IsGZip(isGZip)
{
#ifdef _DEBUG
	setDebugName("CZipReader");
#endif

	if (File) {
		File->grab();

		// load file entries
		if (IsGZip)
			while (scanGZipHeader()) {
			}
		else
			while (scanZipHeader()) {
			}

		sort();
	}
}